

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O2

void instruct_close(Proc *proc,BasicBlock *block,Scope *scope,uint line_number)

{
  BasicBlock *pBVar1;
  Instruction *pIVar2;
  int *piVar3;
  PtrListIterator symboliter__;
  
  pIVar2 = raviX_last_instruction(block);
  if ((pIVar2 == (Instruction *)0x0) || (*(char *)pIVar2 != '\x01')) {
    pBVar1 = proc->current_bb;
    proc->current_bb = block;
    raviX_ptrlist_forward_iterator(&symboliter__,(PtrList *)scope->symbol_list);
    do {
      piVar3 = (int *)raviX_ptrlist_iter_next(&symboliter__);
      if (piVar3 == (int *)0x0) goto LAB_0011931d;
    } while ((*piVar3 != 0) || ((*(byte *)(piVar3 + 0xc) & 1) == 0));
    if (*(long *)(piVar3 + 0xe) == 0) {
      __assert_fail("symbol->variable.pseudo",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x928,"void instruct_close(Proc *, BasicBlock *, Scope *, unsigned int)");
    }
    pIVar2 = allocate_instruction(proc,op_close,line_number);
    add_instruction_operand(proc,pIVar2,*(Pseudo **)(piVar3 + 0xe));
    add_instruction(proc,pIVar2);
LAB_0011931d:
    proc->current_bb = pBVar1;
  }
  return;
}

Assistant:

static void instruct_close(Proc *proc, BasicBlock *block, Scope *scope, unsigned line_number)
{
	if (is_already_closed(proc, block))
		return;
	/* temporarily make block current */
	BasicBlock *prev_current = proc->current_bb;
	proc->current_bb = block;

	LuaSymbol *symbol;
	FOR_EACH_PTR(scope->symbol_list, LuaSymbol, symbol)
	{
		/* We add the first escaping variable as the operand to op_close.
		 * op_close is meant to scan the stack from that point and close
		 * any open upvalues
		 */
		if (symbol->symbol_type == SYM_LOCAL && symbol->variable.escaped) {
			assert(symbol->variable.pseudo);
			Instruction *insn = allocate_instruction(proc, op_close, line_number);
			add_instruction_operand(proc, insn, symbol->variable.pseudo);
			add_instruction(proc, insn);
			break;
		}
	}
	END_FOR_EACH_PTR(symbol)
	
	/* restore current basic block */
	proc->current_bb = prev_current;
}